

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O1

signature signature_create(size_t count)

{
  signature __ptr;
  set psVar1;
  set *ppsVar2;
  
  __ptr = (signature)malloc(count * 0x18 + 0x18);
  if (__ptr != (signature)0x0) {
    psVar1 = set_create(hash_callback_str,comparable_callback_str);
    __ptr->map = psVar1;
    if (psVar1 != (set)0x0) {
      __ptr->ret = (type)0x0;
      __ptr->count = count;
      if (count == 0) {
        return __ptr;
      }
      ppsVar2 = &__ptr[1].map;
      do {
        ((signature_type *)(ppsVar2 + -1))->ret = (type)0xffffffffffffffff;
        *ppsVar2 = (set)0x0;
        ppsVar2[1] = (set)0x0;
        ppsVar2 = ppsVar2 + 3;
        count = count - 1;
      } while (count != 0);
      return __ptr;
    }
    log_write_impl_va("metacall",0x5e,"signature_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_signature.c"
                      ,LOG_LEVEL_ERROR,"Invalid signature set allocation");
    free(__ptr);
  }
  return (signature)0x0;
}

Assistant:

signature signature_create(size_t count)
{
	signature s = malloc(sizeof(struct signature_type) + sizeof(struct signature_node_type) * count);

	if (s != NULL)
	{
		size_t index;

		s->map = set_create(&hash_callback_str, &comparable_callback_str);

		if (s->map == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid signature set allocation");

			free(s);

			return NULL;
		}

		s->ret = NULL;

		s->count = count;

		for (index = 0; index < count; ++index)
		{
			signature_node node = signature_at(s, index);

			if (node != NULL)
			{
				node->index = REFLECT_SIGNATURE_INVALID_INDEX;
				node->name = NULL;
				node->t = NULL;
			}
		}

		return s;
	}

	return NULL;
}